

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O2

bool Potassco::matchAtomArg(char **input,StringSpan *arg)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  
  pcVar2 = *input;
  iVar4 = 0;
  pcVar3 = pcVar2;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '\"') {
      bVar5 = false;
      while( true ) {
        pcVar3 = pcVar3 + 1;
        cVar1 = *pcVar3;
        if ((cVar1 == '\0') || (cVar1 == '\"' && !bVar5)) break;
        bVar5 = (bool)((bVar5 ^ 1U) & cVar1 == '\\');
      }
      if (cVar1 == '\0') {
        return false;
      }
    }
    else if (cVar1 == '(') {
      iVar4 = iVar4 + 1;
    }
    else if (cVar1 == ')') {
      if (iVar4 < 1) {
LAB_0018b44f:
        arg->first = pcVar2;
        arg->size = (long)pcVar3 - (long)pcVar2;
        *input = pcVar3;
        return (long)pcVar3 - (long)pcVar2 != 0;
      }
      iVar4 = iVar4 + -1;
    }
    else if (cVar1 == ',') {
      if (iVar4 == 0) goto LAB_0018b44f;
    }
    else if (cVar1 == '\0') goto LAB_0018b44f;
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

bool matchAtomArg(const char*& input, StringSpan& arg) {
	const char* scan = input;
	for (int p = 0; *scan; ++scan) {
		if      (*scan == '(') { ++p; }
		else if (*scan == ')') { if (--p < 0) { break; } }
		else if (*scan == ',') { if (p == 0) { break; } }
		else if (*scan == '"') {
			bool quoted = false;
			for (++scan; *scan && (*scan != '\"' || quoted); ++scan) {
				quoted = !quoted && *scan == '\\';
			}
			if (!*scan) { return false; }
		}
	}
	arg = toSpan(input, static_cast<std::size_t>(scan - input));
	input = scan;
	return arg.size != 0;
}